

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseStringToStream<1u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *os)

{
  GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this_00;
  byte bVar1;
  char cVar2;
  byte *pbVar3;
  Ch *pCVar4;
  char *pcVar5;
  bool bVar6;
  uint codepoint;
  uint uVar7;
  size_t escapeOffset;
  
  this_00 = this + 0x30;
  do {
    while( true ) {
      pbVar3 = (byte *)is->src_;
      bVar1 = *pbVar3;
      if (bVar1 != 0x5c) break;
      escapeOffset = (long)pbVar3 - (long)is->head_;
      is->src_ = (Ch *)(pbVar3 + 1);
      cVar2 = ""[pbVar3[1]];
      if (cVar2 == '\0') {
        if (pbVar3[1] != 0x75) {
          ParseStringToStream<1u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                    ();
          return;
        }
        is->src_ = (Ch *)(pbVar3 + 2);
        codepoint = ParseHex4<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                              (this,is,escapeOffset);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        if ((codepoint & 0xfffffc00) == 0xd800) {
          pcVar5 = is->src_;
          if (*pcVar5 != '\\') {
LAB_0061260e:
            *(undefined4 *)(this + 0x30) = 9;
            *(size_t *)(this + 0x38) = escapeOffset;
            return;
          }
          is->src_ = pcVar5 + 1;
          if (pcVar5[1] != 'u') {
            ParseStringToStream<1u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                      (this_00);
            goto LAB_0061260e;
          }
          is->src_ = pcVar5 + 2;
          uVar7 = ParseHex4<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                            (this,is,escapeOffset);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          if (uVar7 - 0xe000 < 0xfffffc00) goto LAB_0061260e;
          codepoint = codepoint * 0x400 + uVar7 + 0xfca02400;
        }
        UTF8<char>::Encode<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                  (os,codepoint);
      }
      else {
        is->src_ = (Ch *)(pbVar3 + 2);
        pcVar5 = os->dst_;
        if (pcVar5 == (char *)0x0) {
LAB_00612577:
          __assert_fail("dst_ != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/rapidjson/include/rapidjson/stream.h"
                        ,0x9b,
                        "void rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>::Put(Ch) [Encoding = rapidjson::UTF8<>]"
                       );
        }
        os->dst_ = pcVar5 + 1;
        *pcVar5 = cVar2;
      }
    }
    if (bVar1 == 0x22) {
      is->src_ = (Ch *)(pbVar3 + 1);
      pCVar4 = os->dst_;
      if (pCVar4 != (Ch *)0x0) {
        os->dst_ = pCVar4 + 1;
        *pCVar4 = '\0';
        return;
      }
      goto LAB_00612577;
    }
    if (bVar1 < 0x20) {
      if (bVar1 != 0) {
        if (*(int *)this_00 != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                        ,0x415,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseStringToStream(InputStream &, OutputStream &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, SEncoding = rapidjson::UTF8<>, TEncoding = rapidjson::UTF8<>, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, OutputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>]"
                       );
        }
        pCVar4 = is->head_;
        goto LAB_0061254c;
      }
      if (*(int *)this_00 != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                      ,0x413,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseStringToStream(InputStream &, OutputStream &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, SEncoding = rapidjson::UTF8<>, TEncoding = rapidjson::UTF8<>, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, OutputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>]"
                     );
      }
      pCVar4 = is->head_;
      *(undefined4 *)(this + 0x30) = 0xb;
      goto LAB_00612553;
    }
    pCVar4 = is->head_;
    bVar6 = Transcoder<rapidjson::UTF8<char>,rapidjson::UTF8<char>>::
            Transcode<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                      (is,os);
    if (!bVar6) {
      if (*(int *)this_00 != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                      ,0x41c,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseStringToStream(InputStream &, OutputStream &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, SEncoding = rapidjson::UTF8<>, TEncoding = rapidjson::UTF8<>, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, OutputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>]"
                     );
      }
LAB_0061254c:
      *(undefined4 *)(this + 0x30) = 0xc;
LAB_00612553:
      *(long *)(this + 0x38) = (long)pbVar3 - (long)pCVar4;
      return;
    }
  } while( true );
}

Assistant:

RAPIDJSON_FORCEINLINE void ParseStringToStream(InputStream& is, OutputStream& os) {
//!@cond RAPIDJSON_HIDDEN_FROM_DOXYGEN
#define Z16 0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0
        static const char escape[256] = {
            Z16, Z16, 0, 0,'\"', 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,'/',
            Z16, Z16, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,'\\', 0, 0, 0,
            0, 0,'\b', 0, 0, 0,'\f', 0, 0, 0, 0, 0, 0, 0,'\n', 0,
            0, 0,'\r', 0,'\t', 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
            Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16
        };
#undef Z16
//!@endcond

        for (;;) {
            // Scan and copy string before "\\\"" or < 0x20. This is an optional optimzation.
            if (!(parseFlags & kParseValidateEncodingFlag))
                ScanCopyUnescapedString(is, os);

            Ch c = is.Peek();
            if (RAPIDJSON_UNLIKELY(c == '\\')) {    // Escape
                size_t escapeOffset = is.Tell();    // For invalid escaping, report the inital '\\' as error offset
                is.Take();
                Ch e = is.Peek();
                if ((sizeof(Ch) == 1 || unsigned(e) < 256) && RAPIDJSON_LIKELY(escape[static_cast<unsigned char>(e)])) {
                    is.Take();
                    os.Put(static_cast<typename TEncoding::Ch>(escape[static_cast<unsigned char>(e)]));
                }
                else if (RAPIDJSON_LIKELY(e == 'u')) {    // Unicode
                    is.Take();
                    unsigned codepoint = ParseHex4(is, escapeOffset);
                    RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                    if (RAPIDJSON_UNLIKELY(codepoint >= 0xD800 && codepoint <= 0xDBFF)) {
                        // Handle UTF-16 surrogate pair
                        if (RAPIDJSON_UNLIKELY(!Consume(is, '\\') || !Consume(is, 'u')))
                            RAPIDJSON_PARSE_ERROR(kParseErrorStringUnicodeSurrogateInvalid, escapeOffset);
                        unsigned codepoint2 = ParseHex4(is, escapeOffset);
                        RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                        if (RAPIDJSON_UNLIKELY(codepoint2 < 0xDC00 || codepoint2 > 0xDFFF))
                            RAPIDJSON_PARSE_ERROR(kParseErrorStringUnicodeSurrogateInvalid, escapeOffset);
                        codepoint = (((codepoint - 0xD800) << 10) | (codepoint2 - 0xDC00)) + 0x10000;
                    }
                    TEncoding::Encode(os, codepoint);
                }
                else
                    RAPIDJSON_PARSE_ERROR(kParseErrorStringEscapeInvalid, escapeOffset);
            }
            else if (RAPIDJSON_UNLIKELY(c == '"')) {    // Closing double quote
                is.Take();
                os.Put('\0');   // null-terminate the string
                return;
            }
            else if (RAPIDJSON_UNLIKELY(static_cast<unsigned>(c) < 0x20)) { // RFC 4627: unescaped = %x20-21 / %x23-5B / %x5D-10FFFF
                if (c == '\0')
                    RAPIDJSON_PARSE_ERROR(kParseErrorStringMissQuotationMark, is.Tell());
                else
                    RAPIDJSON_PARSE_ERROR(kParseErrorStringInvalidEncoding, is.Tell());
            }
            else {
                size_t offset = is.Tell();
                if (RAPIDJSON_UNLIKELY((parseFlags & kParseValidateEncodingFlag ?
                    !Transcoder<SEncoding, TEncoding>::Validate(is, os) :
                    !Transcoder<SEncoding, TEncoding>::Transcode(is, os))))
                    RAPIDJSON_PARSE_ERROR(kParseErrorStringInvalidEncoding, offset);
            }
        }
    }